

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O2

DdNode * cuddAddApplyRecur(DdManager *dd,DD_AOP op,DdNode *f,DdNode *g)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  uint uVar7;
  uint index;
  DdNode *g_00;
  DdNode *local_40;
  DdNode *local_38;
  
  local_40 = g;
  local_38 = f;
  pDVar4 = (*op)(dd,&local_38,&local_40);
  if ((pDVar4 == (DdNode *)0x0) &&
     (pDVar4 = cuddCacheLookup2(dd,(DD_CTFP)op,local_38,local_40), pDVar4 == (DdNode *)0x0)) {
    uVar2 = local_38->index;
    uVar3 = 0x7fffffff;
    uVar7 = 0x7fffffff;
    if ((ulong)uVar2 != 0x7fffffff) {
      uVar7 = dd->perm[uVar2];
    }
    index = local_40->index;
    if ((ulong)index != 0x7fffffff) {
      uVar3 = dd->perm[index];
    }
    pDVar4 = local_38;
    pDVar5 = local_38;
    if (uVar7 <= uVar3) {
      pDVar4 = (local_38->type).kids.T;
      pDVar5 = (local_38->type).kids.E;
      index = uVar2;
    }
    pDVar6 = local_40;
    g_00 = local_40;
    if (uVar3 <= uVar7) {
      pDVar6 = (local_40->type).kids.T;
      g_00 = (local_40->type).kids.E;
    }
    pDVar4 = cuddAddApplyRecur(dd,op,pDVar4,pDVar6);
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar5 = cuddAddApplyRecur(dd,op,pDVar5,g_00);
      if (pDVar5 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar6 = pDVar4;
        if ((pDVar4 == pDVar5) ||
           (pDVar6 = cuddUniqueInter(dd,index,pDVar4,pDVar5), pDVar6 != (DdNode *)0x0)) {
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert2(dd,(DD_CTFP)op,local_38,local_40,pDVar6);
          return pDVar6;
        }
        Cudd_RecursiveDeref(dd,pDVar4);
        pDVar4 = pDVar5;
      }
      Cudd_RecursiveDeref(dd,pDVar4);
    }
    pDVar4 = (DdNode *)0x0;
  }
  return pDVar4;
}

Assistant:

DdNode *
cuddAddApplyRecur(
  DdManager * dd,
  DD_AOP op,
  DdNode * f,
  DdNode * g)
{
    DdNode *res,
           *fv, *fvn, *gv, *gvn,
           *T, *E;
    unsigned int ford, gord;
    unsigned int index;
    DD_CTFP cacheOp;

    /* Check terminal cases. Op may swap f and g to increase the
     * cache hit rate.
     */
    statLine(dd);
    res = (*op)(dd,&f,&g);
    if (res != NULL) return(res);

    /* Check cache. */
    cacheOp = (DD_CTFP) op;
    res = cuddCacheLookup2(dd,cacheOp,f,g);
    if (res != NULL) return(res);

    /* Recursive step. */
    ford = cuddI(dd,f->index);
    gord = cuddI(dd,g->index);
    if (ford <= gord) {
        index = f->index;
        fv = cuddT(f);
        fvn = cuddE(f);
    } else {
        index = g->index;
        fv = fvn = f;
    }
    if (gord <= ford) {
        gv = cuddT(g);
        gvn = cuddE(g);
    } else {
        gv = gvn = g;
    }

    T = cuddAddApplyRecur(dd,op,fv,gv);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = cuddAddApplyRecur(dd,op,fvn,gvn);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);

    res = (T == E) ? T : cuddUniqueInter(dd,(int)index,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, T);
        Cudd_RecursiveDeref(dd, E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert2(dd,cacheOp,f,g,res);

    return(res);

}